

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad.h
# Opt level: O2

shared_ptr<hittable_list> box(point3 *a,point3 *b,shared_ptr<material> *mat)

{
  hittable_list *phVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double dVar8;
  double dVar10;
  undefined1 auVar9 [16];
  shared_ptr<hittable_list> sVar11;
  vec3 dy;
  vec3 local_168;
  vec3 local_148;
  element_type *peStack_130;
  undefined1 local_128 [16];
  __shared_ptr<material,_(__gnu_cxx::_Lock_policy)2> local_118;
  undefined1 local_108 [16];
  vec3 local_f8;
  vec3 local_d8;
  vec3 local_b8;
  shared_ptr<material> local_a0;
  undefined8 local_90;
  shared_ptr<hittable> local_88;
  shared_ptr<hittable> local_78;
  shared_ptr<hittable> local_68;
  shared_ptr<hittable> local_58;
  shared_ptr<hittable> local_48;
  shared_ptr<hittable> local_38;
  
  std::make_shared<hittable_list>();
  local_108 = *(undefined1 (*) [16])b->e;
  local_128 = *(undefined1 (*) [16])(b->e + 1);
  local_118 = mat->super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>;
  local_148.e[2] =
       (double)(mat->super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  peStack_130 = mat[1].super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  auVar6 = minpd((undefined1  [16])local_118,local_108);
  dVar8 = (double)(~-(ulong)NAN(local_108._0_8_) & auVar6._0_8_ |
                  (ulong)local_118._M_ptr & -(ulong)NAN(local_108._0_8_));
  dVar10 = (double)(~-(ulong)NAN(local_108._8_8_) & auVar6._8_8_ |
                   (ulong)local_118._M_refcount._M_pi._M_pi & -(ulong)NAN(local_108._8_8_));
  dVar4 = fmin(b->e[2],(double)mat[1].super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr);
  dVar5 = fmax((double)local_108._0_8_,(double)local_118._M_ptr);
  auVar3._8_8_ = peStack_130;
  auVar3._0_8_ = local_148.e[2];
  auVar6 = maxpd(auVar3,local_128);
  uVar2 = (ulong)peStack_130 & -(ulong)NAN(local_128._8_8_);
  auVar9._0_8_ = ~-(ulong)NAN(local_128._0_8_) & auVar6._0_8_;
  auVar9._8_8_ = ~-(ulong)NAN(local_128._8_8_) & auVar6._8_8_;
  auVar6._8_4_ = (int)uVar2;
  auVar6._0_8_ = (ulong)local_148.e[2] & -(ulong)NAN(local_128._0_8_);
  auVar6._12_4_ = (int)(uVar2 >> 0x20);
  local_128 = auVar9 | auVar6;
  local_b8.e[0] = dVar5 - dVar8;
  local_b8.e[1] = 0.0;
  local_b8.e[2] = 0.0;
  local_118._M_refcount._M_pi._0_4_ = SUB84(dVar10,0);
  local_118._M_ptr = (element_type *)dVar10;
  local_118._M_refcount._M_pi._4_4_ = (int)((ulong)dVar10 >> 0x20);
  local_a0.super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_128._0_8_ - dVar10);
  local_a0.super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  local_90 = 0;
  auVar7._0_8_ = local_128._8_8_;
  auVar7._8_4_ = local_128._8_4_;
  auVar7._12_4_ = local_128._12_4_;
  local_d8.e[2] = auVar7._0_8_ - dVar4;
  local_d8.e[0] = 0.0;
  local_d8.e[1] = 0.0;
  local_108._8_8_ = auVar7._8_8_;
  local_108._0_8_ = local_d8.e[2];
  phVar1 = (hittable_list *)a->e[0];
  local_148.e[2] = dVar5;
  local_f8.e[2] = auVar7._0_8_;
  local_f8.e[0] = dVar8;
  local_f8.e[1] = dVar10;
  std::make_shared<quad,vec3,vec3&,vec3&,std::shared_ptr<material>&>
            (&local_168,&local_f8,&local_b8,&local_a0);
  local_38.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_168.e[0];
  local_38.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168.e[1];
  local_168.e[0] = 0.0;
  local_168.e[1] = 0.0;
  hittable_list::add(phVar1,&local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_38.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_168.e + 1));
  phVar1 = (hittable_list *)a->e[0];
  local_f8.e[0] = local_148.e[2];
  local_f8.e[2] = (double)local_128._8_8_;
  local_168.e[2] = -(double)local_108._0_8_;
  local_168.e[0] = -0.0;
  local_168.e[1] = -0.0;
  local_f8.e[1] = dVar10;
  std::make_shared<quad,vec3,vec3,vec3&,std::shared_ptr<material>&>
            (&local_148,&local_f8,&local_168,&local_a0);
  local_48.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_148.e[0];
  local_48.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148.e[1];
  local_148.e[0] = 0.0;
  local_148.e[1] = 0.0;
  hittable_list::add(phVar1,&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_48.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_148.e + 1));
  phVar1 = (hittable_list *)a->e[0];
  local_f8.e[0] = local_148.e[2];
  local_f8.e[1] = (double)local_118._M_ptr;
  local_168.e[2] = -local_b8.e[2];
  local_168.e[0] = (double)((ulong)local_b8.e[0] ^ 0x8000000000000000);
  local_168.e[1] = (double)((ulong)local_b8.e[1] ^ 0x8000000000000000);
  local_f8.e[2] = dVar4;
  std::make_shared<quad,vec3,vec3,vec3&,std::shared_ptr<material>&>
            (&local_148,&local_f8,&local_168,&local_a0);
  local_58.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_148.e[0];
  local_58.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148.e[1];
  local_148.e[0] = 0.0;
  local_148.e[1] = 0.0;
  hittable_list::add(phVar1,&local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_58.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_148.e + 1));
  phVar1 = (hittable_list *)a->e[0];
  local_f8.e[2] = dVar4;
  local_f8.e[0] = dVar8;
  local_f8.e[1] = dVar10;
  std::make_shared<quad,vec3,vec3&,vec3&,std::shared_ptr<material>&>
            (&local_168,&local_f8,&local_d8,&local_a0);
  local_68.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_168.e[0];
  local_68.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168.e[1];
  local_168.e[0] = 0.0;
  local_168.e[1] = 0.0;
  hittable_list::add(phVar1,&local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_68.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_168.e + 1));
  local_f8.e[1] = (double)local_128._0_8_;
  local_f8.e[2] = (double)local_128._8_8_;
  local_168.e[2] = -local_d8.e[2];
  local_168.e[0] = (double)((ulong)local_d8.e[0] ^ 0x8000000000000000);
  local_168.e[1] = (double)((ulong)local_d8.e[1] ^ 0x8000000000000000);
  phVar1 = (hittable_list *)a->e[0];
  local_f8.e[0] = dVar8;
  std::make_shared<quad,vec3,vec3&,vec3,std::shared_ptr<material>&>
            (&local_148,&local_f8,&local_b8,(shared_ptr<material> *)&local_168);
  local_78.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_148.e[0];
  local_78.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148.e[1];
  local_148.e[0] = 0.0;
  local_148.e[1] = 0.0;
  hittable_list::add(phVar1,&local_78);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_78.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_148.e + 1));
  phVar1 = (hittable_list *)a->e[0];
  local_f8.e[1] = dVar10;
  local_f8.e[0] = dVar8;
  local_f8.e[2] = dVar4;
  std::make_shared<quad,vec3,vec3&,vec3&,std::shared_ptr<material>&>
            (&local_168,&local_f8,&local_b8,(shared_ptr<material> *)&local_d8);
  local_88.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_168.e[0];
  local_88.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168.e[1];
  local_168.e[0] = 0.0;
  local_168.e[1] = 0.0;
  hittable_list::add(phVar1,&local_88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_88.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_168.e + 1));
  sVar11.super___shared_ptr<hittable_list,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar11.super___shared_ptr<hittable_list,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)a;
  return (shared_ptr<hittable_list>)
         sVar11.super___shared_ptr<hittable_list,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline shared_ptr<hittable_list> box(const point3& a, const point3& b, shared_ptr<material> mat)
{
    // Returns the 3D box (six sides) that contains the two opposite vertices a & b.

    auto sides = make_shared<hittable_list>();

    // Construct the two opposite vertices with the minimum and maximum coordinates.
    auto min = point3(std::fmin(a.x(),b.x()), std::fmin(a.y(),b.y()), std::fmin(a.z(),b.z()));
    auto max = point3(std::fmax(a.x(),b.x()), std::fmax(a.y(),b.y()), std::fmax(a.z(),b.z()));

    auto dx = vec3(max.x() - min.x(), 0, 0);
    auto dy = vec3(0, max.y() - min.y(), 0);
    auto dz = vec3(0, 0, max.z() - min.z());

    sides->add(make_shared<quad>(point3(min.x(), min.y(), max.z()),  dx,  dy, mat)); // front
    sides->add(make_shared<quad>(point3(max.x(), min.y(), max.z()), -dz,  dy, mat)); // right
    sides->add(make_shared<quad>(point3(max.x(), min.y(), min.z()), -dx,  dy, mat)); // back
    sides->add(make_shared<quad>(point3(min.x(), min.y(), min.z()),  dz,  dy, mat)); // left
    sides->add(make_shared<quad>(point3(min.x(), max.y(), max.z()),  dx, -dz, mat)); // top
    sides->add(make_shared<quad>(point3(min.x(), min.y(), min.z()),  dx,  dz, mat)); // bottom

    return sides;
}